

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::CommitVkVertexBuffers(DeviceContextVkImpl *this)

{
  Uint32 *Args_5;
  uint uVar1;
  PipelineStateVkImpl *this_00;
  BufferVkImpl *pBuffer;
  Uint64 UVar2;
  byte bVar3;
  Uint32 UVar4;
  VkBuffer pVVar5;
  size_t sVar6;
  VkDeviceSize VVar7;
  ulong uVar8;
  Uint64 *pUVar9;
  string msg;
  VkBuffer vkVertexBuffers [32];
  VkDeviceSize Offsets [32];
  
  Args_5 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams;
  uVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams;
  UVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
                    (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                      m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  if (uVar1 < UVar4) {
    this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    vkVertexBuffers[0]._0_4_ =
         PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
                   (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                     m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    LogError<false,char[33],char_const*,char[11],unsigned_int,char[31],unsigned_int,char[10]>
              (false,"CommitVkVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x277,(char (*) [33])"Currently bound pipeline state \'",
               (char **)&(this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         .m_Desc,(char (*) [11])"\' expects ",(uint *)vkVertexBuffers,
               (char (*) [31])" input buffer slots, but only ",Args_5,(char (*) [10])0x5b31a2);
  }
  if (0x20 < *Args_5) {
    FormatString<char[31]>(&msg,(char (*) [31])"Too many buffers are being set");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitVkVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x27c);
    std::__cxx11::string::~string((string *)&msg);
  }
  pUVar9 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_VertexStreams[0].Offset;
  bVar3 = 0;
  for (uVar8 = 0; uVar1 = *Args_5, uVar8 < uVar1; uVar8 = uVar8 + 1) {
    pBuffer = (((VertexStreamInfo<Diligent::BufferVkImpl> *)(pUVar9 + -1))->pBuffer).m_pObject;
    if (pBuffer == (BufferVkImpl *)0x0) {
      pVVar5 = BufferVkImpl::GetVkBuffer((this->m_DummyVB).m_pObject);
      vkVertexBuffers[uVar8] = pVVar5;
      VVar7 = 0;
    }
    else {
      if ((pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Usage == USAGE_DYNAMIC) {
        DvpVerifyDynamicAllocation(this,pBuffer);
        bVar3 = 1;
      }
      pVVar5 = BufferVkImpl::GetVkBuffer(pBuffer);
      vkVertexBuffers[uVar8] = pVVar5;
      UVar2 = *pUVar9;
      sVar6 = GetDynamicBufferOffset(this,pBuffer,true);
      VVar7 = sVar6 + UVar2;
    }
    Offsets[uVar8] = VVar7;
    pUVar9 = pUVar9 + 2;
  }
  if (uVar1 != 0) {
    VulkanUtilities::VulkanCommandBuffer::BindVertexBuffers
              (&this->m_CommandBuffer,0,uVar1,vkVertexBuffers,Offsets);
  }
  (this->m_State).CommittedVBsUpToDate = (bool)(~bVar3 & 1);
  return;
}

Assistant:

void DeviceContextVkImpl::CommitVkVertexBuffers()
{
#ifdef DILIGENT_DEVELOPMENT
    if (m_NumVertexStreams < m_pPipelineState->GetNumBufferSlotsUsed())
        LOG_ERROR("Currently bound pipeline state '", m_pPipelineState->GetDesc().Name, "' expects ", m_pPipelineState->GetNumBufferSlotsUsed(), " input buffer slots, but only ", m_NumVertexStreams, " is bound");
#endif
    // Do not initialize array with zeros for performance reasons
    VkBuffer     vkVertexBuffers[MAX_BUFFER_SLOTS]; // = {}
    VkDeviceSize Offsets[MAX_BUFFER_SLOTS];
    VERIFY(m_NumVertexStreams <= MAX_BUFFER_SLOTS, "Too many buffers are being set");
    bool DynamicBufferPresent = false;
    for (Uint32 slot = 0; slot < m_NumVertexStreams; ++slot)
    {
        VertexStreamInfo<BufferVkImpl>& CurrStream = m_VertexStreams[slot];
        if (BufferVkImpl* pBufferVk = CurrStream.pBuffer)
        {
            if (pBufferVk->GetDesc().Usage == USAGE_DYNAMIC)
            {
                DynamicBufferPresent = true;
#ifdef DILIGENT_DEVELOPMENT
                DvpVerifyDynamicAllocation(pBufferVk);
#endif
            }

            // Device context keeps strong references to all vertex buffers.

            vkVertexBuffers[slot] = pBufferVk->GetVkBuffer();
            Offsets[slot]         = CurrStream.Offset + GetDynamicBufferOffset(pBufferVk);
        }
        else
        {
            // We can't bind null vertex buffer in Vulkan and have to use a dummy one
            vkVertexBuffers[slot] = m_DummyVB->GetVkBuffer();
            Offsets[slot]         = 0;
        }
    }

    //GraphCtx.FlushResourceBarriers();
    if (m_NumVertexStreams > 0)
        m_CommandBuffer.BindVertexBuffers(0, m_NumVertexStreams, vkVertexBuffers, Offsets);

    // GPU offset for a dynamic vertex buffer can change every time a draw command is invoked
    m_State.CommittedVBsUpToDate = !DynamicBufferPresent;
}